

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

bool __thiscall
btCollisionWorldImporter::convertAllObjects
          (btCollisionWorldImporter *this,btBulletSerializedArrays *arrays)

{
  double *pdVar1;
  char *pcVar2;
  char *pcVar3;
  btCollisionShape **ppbVar4;
  btHashMap<btHashPtr,_btCollisionShape_*> *this_00;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_union_8_2_511b660c_for_btHashPtr_0 aVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char cVar7;
  anon_union_8_2_511b660c_for_btHashPtr_0 aVar8;
  btCollisionShapeData *pbVar9;
  anon_union_8_2_511b660c_for_btHashPtr_0 *paVar10;
  long lVar11;
  int i_2;
  long lVar12;
  long lVar13;
  btCollisionShape *shape;
  char *newname;
  btOptimizedBvh *bvh;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_a0;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_98;
  btHashMap<btHashPtr,_btCollisionObject_*> *local_90;
  btHashMap<btHashPtr,_btCollisionShape_*> *local_88;
  btHashMap<btHashString,_btCollisionShape_*> *local_80;
  btHashMap<btHashPtr,_const_char_*> *local_78;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_70;
  uint local_68;
  undefined4 auStack_40 [4];
  
  local_88 = &this->m_shapeMap;
  btHashMap<btHashPtr,_btCollisionShape_*>::clear(local_88);
  local_90 = &this->m_bodyMap;
  btHashMap<btHashPtr,_btCollisionObject_*>::clear(local_90);
  if (0 < *(int *)(arrays + 4)) {
    lVar13 = 0;
    do {
      local_70._0_4_ = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
      local_70.m_hashValues[1] = extraout_var;
      (**(code **)(*local_70.m_pointer + 0x30))
                (local_70.m_pointer,*(undefined8 *)(*(long *)(arrays + 0x10) + lVar13 * 8));
      local_a0 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x10) + lVar13 * 8)
      ;
      btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
                (&this->m_bvhMap,(btHashPtr *)&local_a0,(btOptimizedBvh **)&local_70.m_pointer);
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(arrays + 4));
  }
  if (0 < *(int *)(arrays + 0x24)) {
    lVar13 = 0;
    do {
      local_70._0_4_ = (*this->_vptr_btCollisionWorldImporter[0x19])(this);
      local_70.m_hashValues[1] = extraout_var_00;
      (**(code **)(*local_70.m_pointer + 0x28))
                (local_70.m_pointer,*(undefined8 *)(*(long *)(arrays + 0x30) + lVar13 * 8));
      local_a0 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x30) + lVar13 * 8)
      ;
      btHashMap<btHashPtr,_btOptimizedBvh_*>::insert
                (&this->m_bvhMap,(btHashPtr *)&local_a0,(btOptimizedBvh **)&local_70.m_pointer);
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(arrays + 0x24));
  }
  this_00 = local_88;
  if (0 < *(int *)(arrays + 0x44)) {
    local_78 = &this->m_objectNameMap;
    local_80 = &this->m_nameShapeMap;
    lVar13 = 0;
    do {
      aVar6 = (anon_union_8_2_511b660c_for_btHashPtr_0)
              ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x50) + lVar13 * 8))->
              m_pointer;
      local_a0.m_pointer = convertCollisionShape(this,(btCollisionShapeData *)aVar6.m_pointer);
      if ((btCollisionShape *)local_a0.m_pointer != (btCollisionShape *)0x0) {
        local_70 = aVar6;
        btHashMap<btHashPtr,_btCollisionShape_*>::insert
                  (this_00,(btHashPtr *)&local_70,(btCollisionShape **)&local_a0.m_pointer);
      }
      if (((btCollisionShape *)local_a0.m_pointer != (btCollisionShape *)0x0) &&
         (*aVar6.m_pointer != 0)) {
        local_98.m_pointer = duplicateName(this,*aVar6.m_pointer);
        local_70.m_pointer = local_a0.m_pointer;
        btHashMap<btHashPtr,_const_char_*>::insert
                  (local_78,(btHashPtr *)&local_70,(char **)&local_98.m_pointer);
        local_70.m_pointer = local_98.m_pointer;
        cVar7 = *local_98.m_pointer;
        if (cVar7 == '\0') {
          local_68 = 0x811c9dc5;
        }
        else {
          local_68 = 0x811c9dc5;
          aVar6 = local_98;
          do {
            aVar6.m_pointer = aVar6.m_pointer + 1;
            local_68 = ((int)cVar7 ^ local_68) * 0x1000193;
            cVar7 = *aVar6.m_pointer;
          } while (cVar7 != '\0');
        }
        btHashMap<btHashString,_btCollisionShape_*>::insert
                  (local_80,(btHashString *)&local_70,(btCollisionShape **)&local_a0.m_pointer);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(arrays + 0x44));
  }
  if (0 < *(int *)(arrays + 0xe4)) {
    lVar13 = 0;
    do {
      aVar6 = (anon_union_8_2_511b660c_for_btHashPtr_0)
              ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0xf0) + lVar13 * 8))->
              m_pointer;
      local_70 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)((long)aVar6.m_pointer + 8);
      iVar5 = btHashMap<btHashPtr,_btCollisionShape_*>::findIndex(this_00,(btHashPtr *)&local_70);
      ppbVar4 = (this->m_shapeMap).m_valueArray.m_data;
      if ((ppbVar4 == (btCollisionShape **)0x0 || iVar5 == -1) ||
         (ppbVar4[iVar5] == (btCollisionShape *)0x0)) {
        puts("error: no shape found");
      }
      else {
        *(long *)((long)aVar6.m_pointer + 0x98) = 0;
        lVar11 = 0;
        paVar10 = &local_70;
        aVar8 = aVar6;
        do {
          aVar8.m_pointer = aVar8.m_pointer + 0x20;
          lVar12 = 0;
          do {
            pdVar1 = (double *)((long)aVar8.m_pointer + lVar12 * 8);
            *(ulong *)((long)paVar10 + lVar12 * 4) = CONCAT44((float)pdVar1[1],(float)*pdVar1);
            lVar12 = lVar12 + 2;
          } while (lVar12 != 4);
          lVar11 = lVar11 + 1;
          paVar10 = paVar10 + 2;
        } while (lVar11 != 3);
        lVar11 = 0x10;
        do {
          pdVar1 = (double *)((long)aVar6.m_pointer + lVar11 * 8);
          *(ulong *)((long)&local_80 + lVar11 * 4) = CONCAT44((float)pdVar1[1],(float)*pdVar1);
          lVar11 = lVar11 + 2;
        } while (lVar11 != 0x14);
        local_a0._0_4_ =
             (*this->_vptr_btCollisionWorldImporter[3])
                       (this,&local_70,ppbVar4[iVar5],*(long *)((long)aVar6.m_pointer + 0x18));
        local_a0.m_hashValues[1] = extraout_var_01;
        iVar5 = *(int *)((long)local_a0.m_pointer + 0x148);
        pcVar2 = ((btCollisionShapeData *)((long)aVar6.m_pointer + 400))->m_name;
        *(int *)((long)local_a0.m_pointer + 0x148) = iVar5 + 1;
        pcVar3 = ((btCollisionShapeData *)((long)aVar6.m_pointer + 0x1a0))->m_name;
        *(int *)((long)local_a0.m_pointer + 0x148) = iVar5 + 2;
        *(ulong *)((long)local_a0.m_pointer + 0xf4) =
             CONCAT44((float)(double)pcVar3,(float)(double)pcVar2);
        local_98 = aVar6;
        btHashMap<btHashPtr,_btCollisionObject_*>::insert
                  (local_90,(btHashPtr *)&local_98,(btCollisionObject **)&local_a0.m_pointer);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(arrays + 0xe4));
  }
  if (0 < *(int *)(arrays + 0x104)) {
    lVar13 = 0;
    do {
      aVar6 = (anon_union_8_2_511b660c_for_btHashPtr_0)
              ((anon_union_8_2_511b660c_for_btHashPtr_0 *)(*(long *)(arrays + 0x110) + lVar13 * 8))
              ->m_pointer;
      local_70 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)((long)aVar6.m_pointer + 8);
      iVar5 = btHashMap<btHashPtr,_btCollisionShape_*>::findIndex(this_00,(btHashPtr *)&local_70);
      ppbVar4 = (this->m_shapeMap).m_valueArray.m_data;
      if ((ppbVar4 == (btCollisionShape **)0x0 || iVar5 == -1) ||
         (ppbVar4[iVar5] == (btCollisionShape *)0x0)) {
        puts("error: no shape found");
      }
      else {
        pbVar9 = (btCollisionShapeData *)((long)aVar6.m_pointer + 0x20);
        pcVar2 = (char *)((long)aVar6.m_pointer + 0x5c);
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        lVar11 = 0;
        paVar10 = &local_70;
        do {
          lVar12 = 0;
          do {
            paVar10->m_hashValues[lVar12] = *(int *)(pbVar9->m_padding + lVar12 * 4 + -0xc);
            lVar12 = lVar12 + 1;
          } while (lVar12 != 4);
          lVar11 = lVar11 + 1;
          paVar10 = paVar10 + 2;
          pbVar9 = pbVar9 + 1;
        } while (lVar11 != 3);
        lVar11 = 0xc;
        do {
          *(undefined4 *)((long)&local_70 + lVar11 * 4) =
               *(undefined4 *)((long)aVar6.m_pointer + lVar11 * 4 + 0x20);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x10);
        local_a0._0_4_ =
             (*this->_vptr_btCollisionWorldImporter[3])
                       (this,&local_70,ppbVar4[iVar5],*(long *)((long)aVar6.m_pointer + 0x18));
        local_a0.m_hashValues[1] = extraout_var_02;
        local_98 = aVar6;
        btHashMap<btHashPtr,_btCollisionObject_*>::insert
                  (local_90,(btHashPtr *)&local_98,(btCollisionObject **)&local_a0.m_pointer);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < *(int *)(arrays + 0x104));
  }
  return true;
}

Assistant:

bool	btCollisionWorldImporter::convertAllObjects( btBulletSerializedArrays* arrays)
{

	m_shapeMap.clear();
	m_bodyMap.clear();

	int i;

	for (i=0;i<arrays->m_bvhsDouble.size();i++)
	{
		btOptimizedBvh* bvh = createOptimizedBvh();
		btQuantizedBvhDoubleData* bvhData = arrays->m_bvhsDouble[i];
		bvh->deSerializeDouble(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsDouble[i],bvh);
	}
	for (i=0;i<arrays->m_bvhsFloat.size();i++)
    {
        btOptimizedBvh* bvh = createOptimizedBvh();
   		btQuantizedBvhFloatData* bvhData = arrays->m_bvhsFloat[i];
		bvh->deSerializeFloat(*bvhData);
		m_bvhMap.insert(arrays->m_bvhsFloat[i],bvh);
	}





	for (i=0;i<arrays->m_colShapeData.size();i++)
	{
		btCollisionShapeData* shapeData = arrays->m_colShapeData[i];
		btCollisionShape* shape = convertCollisionShape(shapeData);
		if (shape)
		{
	//		printf("shapeMap.insert(%x,%x)\n",shapeData,shape);
			m_shapeMap.insert(shapeData,shape);
		}

		if (shape&& shapeData->m_name)
		{
			char* newname = duplicateName(shapeData->m_name);
			m_objectNameMap.insert(shape,newname);
			m_nameShapeMap.insert(newname,shape);
		}
	}


	for (i=0;i<arrays->m_collisionObjectDataDouble.size();i++)
	{
        btCollisionObjectDoubleData* colObjData = arrays->m_collisionObjectDataDouble[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeDouble(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);
            body->setFriction(btScalar(colObjData->m_friction));
            body->setRestitution(btScalar(colObjData->m_restitution));

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
	}
	for (i=0;i<arrays->m_collisionObjectDataFloat.size();i++)
	{
        btCollisionObjectFloatData* colObjData = arrays->m_collisionObjectDataFloat[i];
        btCollisionShape** shapePtr = m_shapeMap.find(colObjData->m_collisionShape);
        if (shapePtr && *shapePtr)
        {
            btTransform startTransform;
            colObjData->m_worldTransform.m_origin.m_floats[3] = 0.f;
            startTransform.deSerializeFloat(colObjData->m_worldTransform);

            btCollisionShape* shape = (btCollisionShape*)*shapePtr;
            btCollisionObject* body = createCollisionObject(startTransform,shape,colObjData->m_name);

#ifdef USE_INTERNAL_EDGE_UTILITY
            if (shape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
            {
                btBvhTriangleMeshShape* trimesh = (btBvhTriangleMeshShape*)shape;
                if (trimesh->getTriangleInfoMap())
                {
                    body->setCollisionFlags(body->getCollisionFlags()  | btCollisionObject::CF_CUSTOM_MATERIAL_CALLBACK);
                }
            }
#endif //USE_INTERNAL_EDGE_UTILITY
            m_bodyMap.insert(colObjData,body);
        } else
        {
            printf("error: no shape found\n");
        }
    }

	return true;
}